

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O2

LY_ERR ly_path_dup_predicates(ly_ctx *ctx,ly_path_predicate *pred,ly_path_predicate **dup)

{
  int *piVar1;
  int iVar2;
  ly_path_predicate *plVar3;
  long *plVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  
  if (pred != (ly_path_predicate *)0x0) {
    plVar3 = *dup;
    if (plVar3 == (ly_path_predicate *)0x0) {
      plVar4 = (long *)calloc(1,*(long *)((long)&pred[-1].field_1 + 0x28) * 0x38 + 8);
      if (plVar4 == (long *)0x0) goto LAB_00115af6;
      lVar8 = 0;
    }
    else {
      plVar4 = (long *)realloc((void *)((long)&plVar3[-1].field_1 + 0x28),
                               (*(long *)((long)&pred[-1].field_1 + 0x28) +
                               *(long *)((long)&plVar3[-1].field_1 + 0x28)) * 0x38 + 8);
      if (plVar4 == (long *)0x0) {
LAB_00115af6:
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_path_dup_predicates");
        return LY_EMEM;
      }
      lVar8 = *plVar4;
    }
    *dup = (ly_path_predicate *)(plVar4 + 1);
    uVar7 = *(ulong *)((long)&pred[-1].field_1 + 0x28);
    memset(plVar4 + lVar8 * 7 + 1,0,uVar7 * 0x38);
    lVar8 = 0x10;
    for (uVar6 = 0; uVar6 < uVar7; uVar6 = uVar6 + 1) {
      plVar3 = *dup;
      plVar4 = (long *)((long)&plVar3[-1].field_1 + 0x28);
      *plVar4 = *plVar4 + 1;
      *(ly_path_pred_type *)((long)plVar3 + lVar8 + -0x10) = pred->type;
      iVar2 = *(int *)((long)pred + lVar8 + -0x10);
      if (iVar2 - 1U < 2) {
        *(undefined8 *)((long)plVar3 + lVar8 + -8) = *(undefined8 *)((long)pred + lVar8 + -8);
        (**(code **)(*(long *)(*(long *)((long)&pred->field_1 + lVar8) + 0x10) + 0x30))
                  (ctx,(long)&pred->type + lVar8,(long)&(*dup)->type + lVar8);
        LOCK();
        piVar1 = (int *)(*(long *)((long)&pred->field_1 + lVar8) + 0x1c);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      else if (iVar2 == 3) {
        *(undefined8 *)((long)plVar3 + lVar8 + -8) = *(undefined8 *)((long)pred + lVar8 + -8);
        pcVar5 = strdup(*(char **)((long)&pred->type + lVar8));
        *(char **)((long)&(*dup)->type + lVar8) = pcVar5;
      }
      else if (iVar2 == 0) {
        *(undefined8 *)((long)plVar3 + lVar8 + -8) = *(undefined8 *)((long)pred + lVar8 + -8);
      }
      uVar7 = *(ulong *)((long)&pred[-1].field_1 + 0x28);
      lVar8 = lVar8 + 0x38;
    }
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
ly_path_dup_predicates(const struct ly_ctx *ctx, const struct ly_path_predicate *pred, struct ly_path_predicate **dup)
{
    LY_ARRAY_COUNT_TYPE u;

    if (!pred) {
        return LY_SUCCESS;
    }

    LY_ARRAY_CREATE_RET(ctx, *dup, LY_ARRAY_COUNT(pred), LY_EMEM);
    LY_ARRAY_FOR(pred, u) {
        LY_ARRAY_INCREMENT(*dup);
        (*dup)[u].type = pred->type;

        switch (pred[u].type) {
        case LY_PATH_PREDTYPE_POSITION:
            /* position-predicate */
            (*dup)[u].position = pred[u].position;
            break;
        case LY_PATH_PREDTYPE_LIST:
        case LY_PATH_PREDTYPE_LEAFLIST:
            /* key-predicate or leaf-list-predicate */
            (*dup)[u].key = pred[u].key;
            pred[u].value.realtype->plugin->duplicate(ctx, &pred[u].value, &(*dup)[u].value);
            LY_ATOMIC_INC_BARRIER(((struct lysc_type *)pred[u].value.realtype)->refcount);
            break;
        case LY_PATH_PREDTYPE_LIST_VAR:
            /* key-predicate with a variable */
            (*dup)[u].key = pred[u].key;
            (*dup)[u].variable = strdup(pred[u].variable);
            break;
        }
    }

    return LY_SUCCESS;
}